

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int outch;
  size_t _elemsize;
  int *piVar3;
  int iVar4;
  int _h;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  Option *opt_00;
  int w_tiles;
  long lVar14;
  ulong uVar15;
  Mat *pMVar16;
  long lVar17;
  undefined1 (*pauVar18) [64];
  long lVar19;
  long lVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  long local_e68;
  long local_e58;
  Mat local_e50;
  Mat *local_e00;
  long local_df8;
  Mat *local_df0;
  ulong local_de8;
  Mat *local_de0;
  long local_dd8;
  Mat local_dd0;
  Mat local_d80;
  Mat local_d30;
  long local_ce0;
  long local_cd8;
  long local_cd0;
  long local_cc8;
  long local_cc0;
  long local_cb8;
  long local_cb0;
  long local_ca8;
  void *local_ca0;
  long local_c98;
  long local_c90;
  long local_c88;
  undefined1 auStack_c80 [512];
  undefined1 auStack_a80 [512];
  undefined1 auStack_880 [512];
  undefined1 auStack_680 [512];
  undefined1 auStack_480 [512];
  undefined1 auStack_280 [512];
  undefined1 auStack_80 [80];
  
  iVar13 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  local_dd0.elempack = bottom_blob->elempack;
  iVar1 = top_blob->w;
  iVar2 = top_blob->h;
  outch = top_blob->c;
  piVar3 = bottom_blob->refcount;
  local_dd0.data = bottom_blob->data;
  local_dd0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_dd0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_dd0.elemsize._0_4_ = (undefined4)_elemsize;
  local_dd0.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_de8 = CONCAT44(local_de8._4_4_,local_dd0.elempack);
  local_dd0.allocator = bottom_blob->allocator;
  uVar5 = bottom_blob->dims;
  uVar6 = bottom_blob->w;
  uVar7 = bottom_blob->h;
  uVar8 = bottom_blob->d;
  local_dd0.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  iVar1 = (iVar1 + 5) / 6;
  iVar4 = iVar1 * 6;
  iVar2 = (iVar2 + 5) / 6;
  _h = iVar2 * 6;
  local_df8 = CONCAT44(local_df8._4_4_,iVar4);
  local_e00 = bias;
  local_df0 = kernel_tm;
  local_de0 = top_blob;
  local_dd0.dims = uVar5;
  local_dd0.w = uVar6;
  local_dd0.h = uVar7;
  local_dd0.d = uVar8;
  local_dd0.c = iVar13;
  copy_make_border(bottom_blob,&local_dd0,0,(_h - bottom_blob->h) + 2,0,(iVar4 - bottom_blob->w) + 2
                   ,0,0.0,opt);
  local_d30.cstep = 0;
  local_d30.data = (void *)0x0;
  local_d30.refcount._0_4_ = 0;
  local_d30.refcount._4_4_ = 0;
  local_d30.elemsize._0_4_ = 0;
  local_d30._20_8_ = 0;
  local_d30.allocator = (Allocator *)0x0;
  local_d30.dims = 0;
  local_d30.w = 0;
  local_d30.h = 0;
  local_d30.d = 0;
  local_d30.c = 0;
  iVar4 = (int)local_de8;
  Mat::create(&local_d30,iVar2 * iVar1,0x40,iVar13,_elemsize,(int)local_de8,opt->workspace_allocator
             );
  conv3x3s1_winograd63_transform_input_pack16_avx512(&local_dd0,&local_d30,opt_00);
  pMVar16 = local_de0;
  piVar3 = (int *)CONCAT44(local_dd0.refcount._4_4_,local_dd0.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_dd0.allocator == (Allocator *)0x0) {
        if (local_dd0.data != (void *)0x0) {
          free(local_dd0.data);
        }
      }
      else {
        (*(local_dd0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_dd0.cstep = 0;
  local_dd0.data = (void *)0x0;
  local_dd0.refcount._0_4_ = 0;
  local_dd0.refcount._4_4_ = 0;
  local_dd0.elemsize._0_4_ = 0;
  local_dd0.elemsize._4_4_ = 0;
  local_dd0.elempack = 0;
  local_dd0.h = 0;
  local_dd0.d = 0;
  local_dd0.c = 0;
  local_dd0.allocator = (Allocator *)0x0;
  local_dd0.dims = 0;
  local_dd0.w = 0;
  local_d80.cstep = 0;
  local_d80.data = (void *)0x0;
  local_d80.refcount._0_4_ = 0;
  local_d80.refcount._4_4_ = 0;
  local_d80.elemsize._0_4_ = 0;
  local_d80.elemsize._4_4_ = 0;
  local_d80.elempack = 0;
  local_d80.allocator = (Allocator *)0x0;
  local_d80.dims = 0;
  local_d80.w = 0;
  local_d80.h = 0;
  local_d80.d = 0;
  local_d80.c = 0;
  convolution_winograd_dot_pack16_avx512(&local_d30,outch,local_df0,&local_d80,opt);
  local_e50.cstep = 0;
  local_e50.data = (void *)0x0;
  local_e50.refcount._0_4_ = 0;
  local_e50.refcount._4_4_ = 0;
  local_e50.elemsize._0_4_ = 0;
  local_e50.elemsize._4_4_ = 0;
  local_e50.elempack = 0;
  local_e50.allocator = (Allocator *)0x0;
  local_e50.dims = 0;
  local_e50.w = 0;
  local_e50.h = 0;
  local_e50.d = 0;
  local_e50.c = 0;
  if (((int)local_df8 == pMVar16->w) && (_h == pMVar16->h)) {
    if (&local_e50 != pMVar16) {
      piVar3 = pMVar16->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_e50.data = pMVar16->data;
      local_e50.refcount._0_4_ = SUB84(pMVar16->refcount,0);
      local_e50.refcount._4_4_ = (undefined4)((ulong)pMVar16->refcount >> 0x20);
      local_e50.elemsize._0_4_ = (undefined4)pMVar16->elemsize;
      local_e50.elemsize._4_4_ = (undefined4)(pMVar16->elemsize >> 0x20);
      local_e50.elempack = pMVar16->elempack;
      local_e50.allocator = pMVar16->allocator;
      uVar9 = pMVar16->dims;
      uVar10 = pMVar16->w;
      uVar11 = pMVar16->h;
      uVar12 = pMVar16->d;
      local_e50.c = pMVar16->c;
      local_e50.cstep = pMVar16->cstep;
      local_e50.dims = uVar9;
      local_e50.w = uVar10;
      local_e50.h = uVar11;
      local_e50.d = uVar12;
    }
  }
  else {
    Mat::create(&local_e50,(int)local_df8,_h,outch,_elemsize,iVar4,opt->workspace_allocator);
  }
  local_c98 = (long)local_e50.c;
  if (0 < local_c98) {
    local_ca0 = local_e00->data;
    local_ca8 = (long)local_e50.h;
    local_e00 = (Mat *)(ulong)(uint)(local_e50.h / 6);
    local_c88 = (long)local_e50.w;
    local_de8 = (ulong)(uint)(local_e50.w / 6);
    iVar13 = (local_e50.w / 6) * (local_e50.h / 6);
    local_c90 = local_de8 * 0x40;
    local_cb0 = (long)(iVar13 * 0x10) * 4;
    local_cb8 = (long)(iVar13 * 0x20) * 4;
    local_cc0 = (long)(iVar13 * 0x30) * 4;
    local_cc8 = (long)(iVar13 * 0x40) * 4;
    local_cd0 = (long)(iVar13 * 0x50) * 4;
    local_cd8 = (long)(iVar13 * 0x60) * 4;
    local_ce0 = (long)(iVar13 * 0x70) * 4;
    auVar21 = vbroadcastss_avx512f(ZEXT416(0x42000000));
    auVar22 = vbroadcastss_avx512f(ZEXT416(0x40800000));
    auVar23 = vbroadcastss_avx512f(ZEXT416(0x41000000));
    auVar24 = vbroadcastss_avx512f(ZEXT416(0x41800000));
    auVar25 = vbroadcastss_avx512f(ZEXT416(0x40000000));
    lVar19 = 0;
    do {
      local_dd8 = lVar19;
      if (local_ca0 == (void *)0x0) {
        auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar34 = *(undefined1 (*) [64])((long)local_ca0 + local_dd8 * 0x40);
      }
      if (5 < local_e50.h) {
        lVar19 = CONCAT44(local_d80.elemsize._4_4_,(undefined4)local_d80.elemsize) * local_d80.cstep
                 * local_dd8;
        local_e68 = (long)local_e50.data +
                    local_e50.cstep *
                    CONCAT44(local_e50.elemsize._4_4_,(undefined4)local_e50.elemsize) * local_dd8 +
                    0x140;
        local_df8 = (long)local_e50.w *
                    CONCAT44(local_e50.elemsize._4_4_,(undefined4)local_e50.elemsize) * 6;
        local_e58 = 0;
        pMVar16 = (Mat *)0x0;
        do {
          local_df0 = pMVar16;
          if (5 < local_e50.w) {
            uVar15 = 0;
            lVar20 = local_e58;
            do {
              lVar14 = -0x200;
              lVar17 = lVar20;
              do {
                auVar27 = *(undefined1 (*) [64])((long)local_d80.data + lVar17 + local_cb0 + lVar19)
                ;
                auVar28 = *(undefined1 (*) [64])((long)local_d80.data + lVar17 + local_cb8 + lVar19)
                ;
                auVar29 = *(undefined1 (*) [64])((long)local_d80.data + lVar17 + local_cc0 + lVar19)
                ;
                auVar30 = *(undefined1 (*) [64])((long)local_d80.data + lVar17 + local_cc8 + lVar19)
                ;
                auVar31 = *(undefined1 (*) [64])((long)local_d80.data + lVar17 + local_cd0 + lVar19)
                ;
                auVar32 = *(undefined1 (*) [64])((long)local_d80.data + lVar17 + local_cd8 + lVar19)
                ;
                auVar26 = vaddps_avx512f(auVar28,auVar27);
                auVar27 = vsubps_avx512f(auVar27,auVar28);
                auVar28 = vaddps_avx512f(auVar30,auVar29);
                auVar29 = vsubps_avx512f(auVar29,auVar30);
                auVar30 = vaddps_avx512f(auVar32,auVar31);
                auVar31 = vsubps_avx512f(auVar31,auVar32);
                auVar32 = vaddps_avx512f(auVar26,*(undefined1 (*) [64])
                                                  ((long)local_d80.data + lVar17 + lVar19));
                auVar33 = vfmadd213ps_avx512f(auVar21,auVar30,auVar28);
                auVar32 = vaddps_avx512f(auVar32,auVar33);
                auVar33 = vfmadd213ps_avx512f(auVar22,auVar28,auVar26);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar30,auVar23);
                auVar28 = vfmadd213ps_avx512f(auVar28,auVar24,auVar26);
                auVar26 = vaddps_avx512f(auVar27,*(undefined1 (*) [64])
                                                  ((long)local_d80.data +
                                                  lVar17 + local_ce0 + lVar19));
                auVar28 = vfmadd231ps_avx512f(auVar28,auVar25,auVar30);
                *(undefined1 (*) [64])(auStack_a80 + lVar14) = auVar32;
                *(undefined1 (*) [64])(auStack_680 + lVar14) = auVar33;
                *(undefined1 (*) [64])(auStack_280 + lVar14) = auVar28;
                auVar28 = vfmadd213ps_avx512f(auVar25,auVar29,auVar27);
                auVar28 = vfmadd231ps_avx512f(auVar28,auVar31,auVar24);
                auVar27 = vfmadd231ps_avx512f(auVar27,auVar29,auVar23);
                auVar27 = vfmadd231ps_avx512f(auVar27,auVar31,auVar22);
                auVar29 = vfmadd213ps_avx512f(auVar29,auVar21,auVar31);
                auVar29 = vaddps_avx512f(auVar26,auVar29);
                *(undefined1 (*) [64])(auStack_880 + lVar14) = auVar28;
                *(undefined1 (*) [64])(auStack_480 + lVar14) = auVar27;
                *(undefined1 (*) [64])(auStack_80 + lVar14) = auVar29;
                lVar17 = lVar17 + (long)(iVar13 * 0x80) * 4;
                lVar14 = lVar14 + 0x40;
              } while (lVar14 != 0);
              pauVar18 = (undefined1 (*) [64])(((long)((uVar15 << 0x25) * 3) >> 0x1e) + local_e68);
              lVar17 = 0x1c0;
              do {
                auVar27 = *(undefined1 (*) [64])((long)&local_dd0.elemsize + lVar17);
                auVar28 = *(undefined1 (*) [64])((long)&local_d80.data + lVar17);
                auVar29 = *(undefined1 (*) [64])((long)&local_d80.cstep + lVar17);
                auVar30 = *(undefined1 (*) [64])((long)&local_d30.h + lVar17);
                auVar31 = vaddps_avx512f(auVar27,*(undefined1 (*) [64])((long)&local_e00 + lVar17));
                auVar27 = vsubps_avx512f(*(undefined1 (*) [64])((long)&local_e00 + lVar17),auVar27);
                auVar32 = vaddps_avx512f(auVar29,auVar28);
                auVar28 = vsubps_avx512f(auVar28,auVar29);
                auVar29 = vaddps_avx512f(*(undefined1 (*) [64])((long)&local_cc0 + lVar17),auVar30);
                auVar30 = vsubps_avx512f(auVar30,*(undefined1 (*) [64])((long)&local_cc0 + lVar17));
                auVar26 = vfmadd213ps_avx512f(auVar21,auVar29,auVar32);
                auVar33 = vaddps_avx512f(auVar34,*(undefined1 (*) [64])
                                                  ((long)&local_e50.elemsize + lVar17));
                auVar33 = vaddps_avx512f(auVar33,auVar31);
                auVar26 = vaddps_avx512f(auVar33,auVar26);
                auVar33 = vfmadd213ps_avx512f(auVar22,auVar32,auVar31);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar29,auVar23);
                auVar33 = vaddps_avx512f(auVar33,auVar34);
                auVar31 = vfmadd213ps_avx512f(auVar32,auVar24,auVar31);
                auVar29 = vfmadd231ps_avx512f(auVar31,auVar25,auVar29);
                auVar29 = vaddps_avx512f(auVar29,auVar34);
                auVar31 = vaddps_avx512f(auVar27,auVar34);
                auVar31 = vaddps_avx512f(auVar31,*(undefined1 (*) [64])(auStack_c80 + lVar17));
                pauVar18[-5] = auVar26;
                pauVar18[-3] = auVar33;
                pauVar18[-1] = auVar29;
                auVar29 = vfmadd213ps_avx512f(auVar25,auVar28,auVar27);
                auVar29 = vfmadd231ps_avx512f(auVar29,auVar30,auVar24);
                auVar29 = vaddps_avx512f(auVar29,auVar34);
                auVar27 = vfmadd231ps_avx512f(auVar27,auVar28,auVar23);
                auVar27 = vfmadd231ps_avx512f(auVar27,auVar30,auVar22);
                auVar27 = vaddps_avx512f(auVar27,auVar34);
                auVar28 = vfmadd213ps_avx512f(auVar28,auVar21,auVar30);
                auVar28 = vaddps_avx512f(auVar31,auVar28);
                pauVar18[-4] = auVar29;
                pauVar18[-2] = auVar27;
                *pauVar18 = auVar28;
                lVar17 = lVar17 + 0x200;
                pauVar18 = (undefined1 (*) [64])(*pauVar18 + (long)(local_e50.w << 4) * 4);
              } while (lVar17 != 0xdc0);
              uVar15 = uVar15 + 1;
              lVar20 = lVar20 + 0x40;
            } while (uVar15 != local_de8);
          }
          pMVar16 = (Mat *)((long)&local_df0->data + 1);
          local_e58 = local_e58 + local_c90;
          local_e68 = local_e68 + local_df8;
        } while (pMVar16 != local_e00);
      }
      lVar19 = local_dd8 + 1;
    } while (local_dd8 + 1 != local_c98);
  }
  copy_cut_border(&local_e50,local_de0,0,local_e50.h - local_de0->h,0,local_e50.w - local_de0->w,opt
                 );
  piVar3 = (int *)CONCAT44(local_e50.refcount._4_4_,local_e50.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_e50.allocator == (Allocator *)0x0) {
        if (local_e50.data != (void *)0x0) {
          free(local_e50.data);
        }
      }
      else {
        (*(local_e50.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_e50.cstep = 0;
  local_e50.data = (void *)0x0;
  local_e50.refcount._0_4_ = 0;
  local_e50.refcount._4_4_ = 0;
  local_e50.elemsize._0_4_ = 0;
  local_e50.elemsize._4_4_ = 0;
  local_e50.elempack = 0;
  local_e50.dims = 0;
  local_e50.w = 0;
  local_e50.h = 0;
  local_e50.d = 0;
  local_e50.c = 0;
  piVar3 = (int *)CONCAT44(local_d80.refcount._4_4_,local_d80.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_d80.allocator == (Allocator *)0x0) {
        if (local_d80.data != (void *)0x0) {
          free(local_d80.data);
        }
      }
      else {
        (*(local_d80.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_d80.cstep = 0;
  local_d80.data = (void *)0x0;
  local_d80.refcount._0_4_ = 0;
  local_d80.refcount._4_4_ = 0;
  local_d80.elemsize._0_4_ = 0;
  local_d80.elemsize._4_4_ = 0;
  local_d80.elempack = 0;
  local_d80.dims = 0;
  local_d80.w = 0;
  local_d80.h = 0;
  local_d80.d = 0;
  local_d80.c = 0;
  piVar3 = (int *)CONCAT44(local_d30.refcount._4_4_,local_d30.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_d30.allocator == (Allocator *)0x0) {
        if (local_d30.data != (void *)0x0) {
          free(local_d30.data);
        }
      }
      else {
        (*(local_d30.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_d30.cstep = 0;
  local_d30.data = (void *)0x0;
  local_d30.refcount._0_4_ = 0;
  local_d30.refcount._4_4_ = 0;
  local_d30.elemsize._0_4_ = 0;
  local_d30._20_8_ = 0;
  local_d30.dims = 0;
  local_d30.w = 0;
  local_d30.h = 0;
  local_d30.d = 0;
  local_d30.c = 0;
  piVar3 = (int *)CONCAT44(local_dd0.refcount._4_4_,local_dd0.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_dd0.allocator == (Allocator *)0x0) {
        if (local_dd0.data != (void *)0x0) {
          free(local_dd0.data);
        }
      }
      else {
        (*(local_dd0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack16_avx512(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack16_avx512(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_pack16_avx512(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}